

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O2

void __thiscall MyServerConnection::MyServerConnection(MyServerConnection *this,MyServer *server)

{
  tonk::SDKConnection::SDKConnection(&this->super_SDKConnection);
  (this->super_SDKConnection)._vptr_SDKConnection = (_func_int **)&PTR__SDKConnection_0010ea80;
  this->StatusLogCounter = 0;
  this->P2PRequested = false;
  this->Server = server;
  this->NextOutgoingWord = 0;
  this->NextPacketIndex = 0;
  (this->OWDStats).SampleCount = 0;
  (this->OWDStats).SampleIndex = 0;
  this->LastStatsUsec = 0;
  return;
}

Assistant:

MyServerConnection(MyServer* server)
        : Server(server)
    {}